

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffgbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  int iVar1;
  long lVar2;
  FITSfile *pFVar3;
  long lVar4;
  size_t __n;
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar3 = fptr->Fptr;
  if (nbytes < 0x21c0) {
    iVar1 = pFVar3->curbuf;
    if (iVar1 < 0) {
      ffldrc(fptr,pFVar3->bytepos / 0xb40,0,status);
      pFVar3 = fptr->Fptr;
      iVar1 = pFVar3->curbuf;
    }
    if (nbytes != 0) {
      lVar2 = pFVar3->bufrecnum[iVar1] * -0xb40 + pFVar3->bytepos;
      __n = 0xb40 - lVar2;
      while( true ) {
        if (nbytes < (long)__n) {
          __n = nbytes;
        }
        memcpy(buffer,fptr->Fptr->iobuffer + lVar2 + (long)fptr->Fptr->curbuf * 0xb40,__n);
        lVar2 = fptr->Fptr->bytepos + __n;
        fptr->Fptr->bytepos = lVar2;
        nbytes = nbytes - __n;
        if (nbytes == 0) break;
        buffer = (void *)((long)buffer + __n);
        ffldrc(fptr,lVar2 / 0xb40,0,status);
        __n = 0xb40;
        lVar2 = 0;
      }
    }
  }
  else {
    lVar2 = pFVar3->bytepos;
    lVar4 = 0;
    do {
      pFVar3 = fptr->Fptr;
      if (((pFVar3->dirty[lVar4] != 0) && (lVar2 / 0xb40 <= pFVar3->bufrecnum[lVar4])) &&
         (pFVar3->bufrecnum[lVar4] <= (lVar2 + nbytes + -1) / 0xb40)) {
        ffbfwt(pFVar3,(int)lVar4,status);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x28);
    pFVar3 = fptr->Fptr;
    if (pFVar3->io_pos != lVar2) {
      ffseek(pFVar3,lVar2);
      pFVar3 = fptr->Fptr;
    }
    ffread(pFVar3,nbytes,buffer,status);
    fptr->Fptr->io_pos = lVar2 + nbytes;
  }
  return *status;
}

Assistant:

int ffgbyt(fitsfile *fptr,    /* I - FITS file pointer             */
           LONGLONG nbytes,       /* I - number of bytes to read       */
           void *buffer,      /* O - buffer to read into           */
           int *status)       /* IO - error status                 */
/*
  get (read) the requested number of bytes from the file, starting at
  the current file position.  Read large blocks of data directly from disk;
  read smaller segments via intermediate IO buffers to improve efficiency.
*/
{
    int ii;
    LONGLONG filepos;
    long recstart, recend, ntodo, bufpos, nspace, nread;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    cptr = (char *)buffer;

    if (nbytes >= MINDIRECT)
    {
      /* read large blocks of data directly from disk instead of via buffers */
      filepos = (fptr->Fptr)->bytepos; /* save the read starting position */

/*  note that in this case, ffmbyt has not been called, and so        */
/*  bufrecnum[(fptr->Fptr)->curbuf] does not point to the intended */
/*  output buffer */

      recstart = (long) (filepos / IOBUFLEN);               /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->dirty[ii] && 
            (fptr->Fptr)->bufrecnum[ii] >= recstart && (fptr->Fptr)->bufrecnum[ii] <= recend)
            {
              ffbfwt(fptr->Fptr, ii, status);    /* flush modified buffer to disk */
            }
      }

       /* move to the correct read position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      ffread(fptr->Fptr, (long) nbytes, cptr, status); /* read the data */
      (fptr->Fptr)->io_pos = filepos + nbytes; /* update the file position */
    }
    else
    {
      /* read small chucks of data using the IO buffers for efficiency */

      if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
      {                              /* so reload the last one that was used */
        ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
      }

      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
                IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      ntodo =  (long) nbytes;
      while (ntodo)
      {
        nread  = minvalue(ntodo, nspace);

        /* copy bytes from IO buffer to user's buffer */
        memcpy(cptr, (fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, nread);
        ntodo -= nread;            /* decrement remaining number of bytes */
        cptr  += nread;
        (fptr->Fptr)->bytepos += nread;    /* increment file position pointer */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), REPORT_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }

    return(*status);
}